

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O2

void biftyp(bifcxdef *ctx,int argc)

{
  runsdef *prVar1;
  runsdef val;
  
  prVar1 = ctx->bifcxrun->runcxsp;
  ctx->bifcxrun->runcxsp = prVar1 + -1;
  val._0_8_ = *(undefined8 *)(prVar1 + -1);
  val.runsv.runsvnum = val._0_8_ & 0xff;
  runpush(ctx->bifcxrun,1,&val);
  return;
}

Assistant:

void biftyp(bifcxdef *ctx, int argc)
{
    runsdef val;
    
    bifcntargs(ctx, 1, argc);
    
    /* get whatever it is, and push the type */
    runpop(ctx->bifcxrun, &val);
    val.runsv.runsvnum = val.runstyp;          /* new value is the datatype */
    runpush(ctx->bifcxrun, DAT_NUMBER, &val);
}